

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_true>::pop_block_(DaTrie<true,_true,_true> *this)

{
  bool bVar1;
  DaTrie<true,_true,_true> *in_RDI;
  uint32_t i_1;
  uint32_t i;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffdc;
  uint local_14;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  undefined4 in_stack_fffffffffffffff4;
  
  bVar1 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::empty
                    ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!bc_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x4c0,
                  "void ddd::DaTrie<true, true, true>::pop_block_() [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  num_blocks((DaTrie<true,_true,_true> *)0x1925fb);
  pop_block_(in_RDI,in_stack_ffffffffffffffdc,
             (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x192617);
  for (uVar2 = 0; uVar2 < 0x100; uVar2 = uVar2 + 1) {
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::pop_back
              ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x192633);
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::pop_back
              ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x192660);
  }
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::pop_back
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x19267b);
  in_RDI->bc_emps_ = in_RDI->bc_emps_ - 0x100;
  return;
}

Assistant:

void pop_block_() {
    assert(!bc_.empty());

    auto block_pos = num_blocks() - 1;
    pop_block_(block_pos, blocks_);

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.pop_back();
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.pop_back();
      }
    }

    blocks_.pop_back();
    bc_emps_ -= BLOCK_SIZE;
  }